

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTreeNode.cpp
# Opt level: O0

void __thiscall itis::AVLTreeNode<int>::updateValues(AVLTreeNode<int> *this)

{
  int *piVar1;
  int local_34;
  int local_30;
  int local_2c;
  int local_24;
  int local_18;
  int local_14;
  AVLTreeNode<int> *local_10;
  AVLTreeNode<int> *this_local;
  
  if (this->left == (AVLTreeNode<int> *)0x0) {
    local_24 = 0;
  }
  else {
    local_24 = this->left->count;
  }
  if (this->right == (AVLTreeNode<int> *)0x0) {
    local_2c = 0;
  }
  else {
    local_2c = this->right->count;
  }
  this->count = local_24 + local_2c + 1;
  if (this->left == (AVLTreeNode<int> *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = this->left->height;
  }
  local_14 = local_30;
  if (this->right == (AVLTreeNode<int> *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = this->right->height;
  }
  local_18 = local_34;
  local_10 = this;
  piVar1 = std::max<int>(&local_14,&local_18);
  this->height = *piVar1 + 1;
  return;
}

Assistant:

void AVLTreeNode<T>::updateValues() {
    count = (left != nullptr ? left->count : 0) + (right != nullptr ? right->count : 0) + 1;

    height = std::max(left != nullptr ? left->height : 0, right != nullptr ? right->height : 0) + 1;
  }